

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Writer::WriteVRR_General_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  OSTEI_VRR_Algorithm_Base *pOVar1;
  bool bVar2;
  RRStepType step;
  int iVar3;
  difference_type dVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  pointer pbVar6;
  pointer am_00;
  char *pcVar7;
  pointer pbVar8;
  allocator local_1f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  amreq_str;
  string local_1d8;
  QAMList amreq;
  string stepstr;
  undefined1 local_180 [48];
  undefined1 local_150 [48];
  undefined1 local_120 [48];
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  StringSet varreq;
  undefined1 local_60 [48];
  
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_60,am);
  step = OSTEI_VRR_Algorithm_Base::GetRRStep(pOVar1,(QAM *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  RRStepTypeToStr_abi_cxx11_(&stepstr,step);
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_f0,am);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_(&varreq,pOVar1,(QAM *)local_f0);
  std::__cxx11::string::~string((string *)(local_f0 + 0x10));
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_120,am);
  OSTEI_VRR_Algorithm_Base::GenerateAMReq(&amreq,pOVar1,(QAM *)local_120,step,true);
  std::__cxx11::string::~string((string *)(local_120 + 0x10));
  amreq_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amreq_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  amreq_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (am_00 = amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
               _M_start;
      am_00 != amreq.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
               _M_finish; am_00 = am_00 + 1) {
    QAM::QAM((QAM *)local_c0,am_00);
    bVar2 = ValidQAM((QAM *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 0x10));
    if (bVar2) {
      PrimVarName_abi_cxx11_(&local_1d8,am_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&amreq_str,
                 &local_1d8);
    }
    else {
      std::__cxx11::string::string((string *)&local_1d8,"NULL",&local_1f9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&amreq_str,
                 &local_1d8);
    }
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 0;
  dVar4 = std::__count_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((int *)am,(int *)&am->tag,(_Iter_equals_val<const_int>)&local_1d8);
  if (dVar4 != 3) {
    poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"ostei_general_vrr_");
    poVar5 = std::operator<<(poVar5,(string *)&stepstr);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[0]);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[1]);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[2]);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[3]);
    poVar5 = std::operator<<(poVar5,", ");
    pOVar1 = this->vrr_algo_;
    QAM::QAM((QAM *)local_180,am);
    iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar1,(QAM *)local_180);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3 + 1);
    poVar5 = std::operator<<(poVar5,",\n");
    std::operator<<(poVar5,(string *)&indent7_abi_cxx11_);
    std::__cxx11::string::~string((string *)(local_180 + 0x10));
    pcVar7 = "one_over_2q, a_over_q, one_over_2pq, aoq_PQ, ";
    if (step < K) {
      pcVar7 = "one_over_2p, a_over_p, one_over_2pq, aop_PQ, ";
    }
    std::operator<<(os,pcVar7);
    if (step < 4) {
      std::operator<<(os,&DAT_00139aa8 + *(int *)(&DAT_00139aa8 + (ulong)step * 4));
    }
    std::operator<<(os,(string *)&indent7_abi_cxx11_);
    pbVar8 = amreq_str.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = amreq_str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar8; pbVar6 = pbVar6 + 1)
    {
      poVar5 = std::operator<<(os,(string *)pbVar6);
      std::operator<<(poVar5,", ");
    }
    PrimVarName_abi_cxx11_(&local_1d8,am);
    poVar5 = std::operator<<(os,(string *)&local_1d8);
    std::operator<<(poVar5,");\n");
    goto LAB_0011827b;
  }
  poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"ostei_general_vrr1_");
  poVar5 = std::operator<<(poVar5,(string *)&stepstr);
  poVar5 = std::operator<<(poVar5,"(");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[(int)step]);
  poVar5 = std::operator<<(poVar5,", ");
  pOVar1 = this->vrr_algo_;
  QAM::QAM((QAM *)local_150,am);
  iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar1,(QAM *)local_150);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3 + 1);
  poVar5 = std::operator<<(poVar5,",\n");
  std::operator<<(poVar5,(string *)&indent7_abi_cxx11_);
  std::__cxx11::string::~string((string *)(local_150 + 0x10));
  pcVar7 = "one_over_2q, a_over_q, aoq_PQ, ";
  if (step < K) {
    pcVar7 = "one_over_2p, a_over_p, aop_PQ, ";
  }
  std::operator<<(os,pcVar7);
  switch((ulong)step) {
  case 0:
    std::operator<<(os,"P_PA,\n");
    poVar5 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)
                                    amreq_str.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,", ");
    break;
  case 1:
    std::operator<<(os,"P_PB,\n");
    poVar5 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)
                                    amreq_str.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,", ");
    goto LAB_0011822f;
  case 2:
    std::operator<<(os,"Q_PA,\n");
    poVar5 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)
                                    amreq_str.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,", ");
    break;
  case 3:
    std::operator<<(os,"Q_PB,\n");
    poVar5 = std::operator<<(os,(string *)&indent7_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)
                                    amreq_str.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    poVar5 = std::operator<<(poVar5,", ");
LAB_0011822f:
    pbVar8 = amreq_str.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    goto LAB_00118238;
  default:
    goto switchD_00117f5b_default;
  }
  pbVar8 = amreq_str.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_00118238:
  poVar5 = std::operator<<(poVar5,(string *)pbVar8);
  std::operator<<(poVar5,", ");
switchD_00117f5b_default:
  PrimVarName_abi_cxx11_(&local_1d8,am);
  poVar5 = std::operator<<(os,(string *)&local_1d8);
  std::operator<<(poVar5,");\n");
LAB_0011827b:
  std::__cxx11::string::~string((string *)&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&amreq_str);
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&amreq);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&varreq._M_t);
  std::__cxx11::string::~string((string *)&stepstr);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_General_(std::ostream & os, QAM am) const
{
    // is this a special case (incrementing with all other AM == 0)?
    RRStepType rrstep = vrr_algo_.GetRRStep(am);
    std::string stepstr = RRStepTypeToStr(rrstep);
    auto varreq = vrr_algo_.GetVarReq(am);

    auto amreq = vrr_algo_.GenerateAMReq(am, rrstep, true);
    std::vector<std::string> amreq_str;
    for(const auto &it : amreq)
    {
        if(!ValidQAM(it))
            amreq_str.push_back("NULL");
        else
            amreq_str.push_back(PrimVarName(it));
    }
    

    if(std::count(am.begin(), am.end(), 0) == 3)
    {
        os << indent5 << "ostei_general_vrr1_" << stepstr << "("
                      << am[static_cast<int>(rrstep)] << ", " << (vrr_algo_.GetMReq(am)+1) << ",\n"
           << indent7;

        if(rrstep == RRStepType::I || rrstep == RRStepType::J)
            os << "one_over_2p, a_over_p, aop_PQ, ";
        else
            os << "one_over_2q, a_over_q, aoq_PQ, ";

        switch(rrstep)
        {
            case RRStepType::I:
                os << "P_PA,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[1] << ", ";
                break;
        
            case RRStepType::J:
                os << "P_PB,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[2] << ", ";
                break;

            case RRStepType::K:
                os << "Q_PA,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[1] << ", ";
                break;

            case RRStepType::L:
                os << "Q_PB,\n";
                os << indent7 << amreq_str[0] << ", "
                              << amreq_str[2] << ", ";
                break;
        }

        os << PrimVarName(am) << ");\n"; // output array

    }
    else
    {
        os << indent5 << "ostei_general_vrr_" << stepstr << "("
                      << am[0] << ", " << am[1] << ", " << am[2] << ", " << am[3] << ", " << (vrr_algo_.GetMReq(am)+1) << ",\n"
           << indent7;

        if(rrstep == RRStepType::I || rrstep == RRStepType::J)
            os << "one_over_2p, a_over_p, one_over_2pq, aop_PQ, ";
        else
            os << "one_over_2q, a_over_q, one_over_2pq, aoq_PQ, ";


        if(rrstep == RRStepType::I)
            os << "P_PA,\n";
        if(rrstep == RRStepType::J)
            os << "P_PB,\n";
        if(rrstep == RRStepType::K)
            os << "Q_PA,\n";
        if(rrstep == RRStepType::L)
            os << "Q_PB,\n";

        os << indent7;
        for(const auto &it : amreq_str)
            os << it << ", ";

        os << PrimVarName(am) << ");\n";
    }
}